

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::SetWindingCount(Clipper *this,TEdge *edge)

{
  PolyType PVar1;
  uint uVar2;
  TEdge **ppTVar3;
  TEdge *pTVar4;
  uint uVar5;
  int iVar6;
  
  PVar1 = edge->polyType;
  pTVar4 = edge;
  do {
    pTVar4 = pTVar4->prevInAEL;
    if (pTVar4 == (TEdge *)0x0) {
      edge->windCnt = edge->windDelta;
      edge->windCnt2 = 0;
      ppTVar3 = &this->m_ActiveEdges;
      uVar5 = 0;
      goto LAB_0066801d;
    }
  } while (pTVar4->polyType != PVar1);
  if ((&this->m_ClipFillType)[PVar1 == ptSubject] == pftEvenOdd) {
    edge->windCnt = 1;
    goto LAB_00668013;
  }
  iVar6 = pTVar4->windDelta;
  uVar5 = pTVar4->windCnt;
  uVar2 = -uVar5;
  if (0 < (int)uVar5) {
    uVar2 = uVar5;
  }
  if ((int)(iVar6 * uVar5) < 0) {
    if (uVar2 < 2) {
      edge->windCnt = iVar6 + uVar5 + edge->windDelta;
      goto LAB_00668013;
    }
    if (-1 < iVar6 * edge->windDelta) {
      iVar6 = edge->windDelta + uVar5;
      goto LAB_00667ffd;
    }
  }
  else if (((uVar2 < 2) || (-1 < iVar6 * edge->windDelta)) &&
          (iVar6 = edge->windDelta + uVar5, iVar6 != 0)) {
LAB_00667ffd:
    edge->windCnt = iVar6;
    goto LAB_00668013;
  }
  edge->windCnt = uVar5;
LAB_00668013:
  uVar5 = pTVar4->windCnt2;
  edge->windCnt2 = uVar5;
  ppTVar3 = &pTVar4->nextInAEL;
LAB_0066801d:
  pTVar4 = *ppTVar3;
  if ((&this->m_ClipFillType)[PVar1 != ptSubject] == pftEvenOdd) {
    for (; pTVar4 != edge; pTVar4 = pTVar4->nextInAEL) {
      uVar5 = (uint)(uVar5 == 0);
      edge->windCnt2 = uVar5;
    }
  }
  else {
    for (; pTVar4 != edge; pTVar4 = pTVar4->nextInAEL) {
      uVar5 = uVar5 + pTVar4->windDelta;
      edge->windCnt2 = uVar5;
    }
  }
  return;
}

Assistant:

void Clipper::SetWindingCount(TEdge &edge)
{
  TEdge *e = edge.prevInAEL;
  //find the edge of the same polytype that immediately preceeds 'edge' in AEL
  while ( e  && e->polyType != edge.polyType ) e = e->prevInAEL;
  if ( !e )
  {
    edge.windCnt = edge.windDelta;
    edge.windCnt2 = 0;
    e = m_ActiveEdges; //ie get ready to calc windCnt2
  } else if ( IsEvenOddFillType(edge) )
  {
    //EvenOdd filling ...
    edge.windCnt = 1;
    edge.windCnt2 = e->windCnt2;
    e = e->nextInAEL; //ie get ready to calc windCnt2
  } else
  {
    //nonZero, Positive or Negative filling ...
    if ( e->windCnt * e->windDelta < 0 )
    {
      if (Abs(e->windCnt) > 1)
      {
        if (e->windDelta * edge.windDelta < 0) edge.windCnt = e->windCnt;
        else edge.windCnt = e->windCnt + edge.windDelta;
      } else
        edge.windCnt = e->windCnt + e->windDelta + edge.windDelta;
    } else
    {
      if ( Abs(e->windCnt) > 1 && e->windDelta * edge.windDelta < 0)
        edge.windCnt = e->windCnt;
      else if ( e->windCnt + edge.windDelta == 0 )
        edge.windCnt = e->windCnt;
      else edge.windCnt = e->windCnt + edge.windDelta;
    }
    edge.windCnt2 = e->windCnt2;
    e = e->nextInAEL; //ie get ready to calc windCnt2
  }

  //update windCnt2 ...
  if ( IsEvenOddAltFillType(edge) )
  {
    //EvenOdd filling ...
    while ( e != &edge )
    {
      edge.windCnt2 = (edge.windCnt2 == 0) ? 1 : 0;
      e = e->nextInAEL;
    }
  } else
  {
    //nonZero, Positive or Negative filling ...
    while ( e != &edge )
    {
      edge.windCnt2 += e->windDelta;
      e = e->nextInAEL;
    }
  }
}